

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall CTPNStrOneOf::gen_code(CTPNStrOneOf *this,int discard,int for_condition)

{
  ushort uVar1;
  uint uVar2;
  CTPNList *pCVar3;
  CTcSymObj *pCVar4;
  CTcPrsNode *pCVar5;
  CTcGenTarg *pCVar6;
  uint16_t tmp_1;
  int iVar7;
  CTcSymbol *pCVar8;
  undefined8 *puVar9;
  undefined4 extraout_var;
  size_t __n;
  char *siz;
  uint uVar10;
  CTPNListEle *pCVar11;
  ulong ofs;
  uint16_t tmp;
  int iVar12;
  bool bVar13;
  char buf [2];
  char buf_1 [5];
  undefined2 local_66;
  uint local_64;
  vm_val_t local_60;
  uint local_4c;
  CTcCodeLabel *local_48;
  CTPNStrOneOf *local_40;
  char local_35 [5];
  
  siz = "getNextIndex";
  local_4c = for_condition;
  pCVar8 = CTcPrsSymtab::find_or_def
                     (G_prs->global_symtab_,"getNextIndex",0xc,0,TCPRS_UNDEF_ADD_PROP_NO_WARNING);
  if (*(int *)&(pCVar8->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 != 3
     ) {
    CTcTokenizer::log_error(0x2d2c);
    return;
  }
  uVar1 = *(ushort *)
           &pCVar8[1].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry
  ;
  local_64 = discard;
  puVar9 = (undefined8 *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x30,(size_t)siz);
  *(undefined4 *)(puVar9 + 1) = 8;
  *(uint *)(puVar9 + 2) = (uint)uVar1;
  *(undefined1 *)(puVar9 + 5) = 0;
  *puVar9 = &PTR_gen_code_0035f6b8;
  iVar7 = (*(((this->super_CTPNStrOneOfBase).lst_)->super_CTPNListBase).super_CTcPrsNode.
            super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[1])();
  if (CONCAT44(extraout_var,iVar7) == 0) {
    pCVar4 = (this->super_CTPNStrOneOfBase).state_obj_;
    __n = 0;
    (*(pCVar4->super_CTcSymObjBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
      super_CVmHashEntry._vptr_CVmHashEntry[0x1e])(pCVar4,0,puVar9,0,0,0,0);
    uVar2 = (((this->super_CTPNStrOneOfBase).lst_)->super_CTPNListBase).cnt_;
    local_40 = this;
    CTcGenTarg::write_op(G_cg,0x90);
    local_60.typ = CONCAT22(local_60.typ._2_2_,(short)uVar2);
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_60,(void *)0x2,__n);
    G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
    ofs = (G_cs->super_CTcDataStream).ofs_;
    if (0 < (int)uVar2) {
      uVar10 = 1;
      do {
        local_60.typ = VM_INT;
        local_60.val.obj = uVar10;
        vmb_put_dh(local_35,&local_60);
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)local_35,(void *)0x5,__n);
        local_66 = 0;
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_66,(void *)0x2,__n);
        __n = (size_t)(uVar10 + 1);
        bVar13 = uVar10 != uVar2;
        uVar10 = uVar10 + 1;
      } while (bVar13);
    }
    local_60.typ = local_60.typ & 0xffff0000;
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_60,(void *)0x2,__n);
    local_48 = CTcCodeStream::new_label_fwd(G_cs);
    uVar10 = local_64;
    pCVar11 = (((local_40->super_CTPNStrOneOfBase).lst_)->super_CTPNListBase).head_;
    if (0 < (int)uVar2 && pCVar11 != (CTPNListEle *)0x0) {
      iVar12 = -5 - (int)ofs;
      iVar7 = 1;
      do {
        local_60.typ = CONCAT22(local_60.typ._2_2_,
                                (short)(G_cs->super_CTcDataStream).ofs_ + (short)iVar12);
        CTcDataStream::write_at(&G_cs->super_CTcDataStream,ofs + 5,(char *)&local_60,2);
        pCVar5 = (pCVar11->super_CTPNListEleBase).expr_;
        (**(pCVar5->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)
                  (pCVar5,(ulong)uVar10,(ulong)local_4c);
        CTcGenTarg::write_op(G_cg,0x91);
        CTcCodeStream::write_ofs(G_cs,local_48,0,0);
        if (uVar10 == 0) {
          G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
        }
        ofs = ofs + 7;
        pCVar11 = (pCVar11->super_CTPNListEleBase).next_;
        if (pCVar11 == (CTPNListEle *)0x0) break;
        iVar12 = iVar12 + -7;
        bVar13 = iVar7 < (int)uVar2;
        iVar7 = iVar7 + 1;
      } while (bVar13);
    }
    local_60.typ = CONCAT22(local_60.typ._2_2_,
                            (short)(int)(G_cs->super_CTcDataStream).ofs_ - (short)ofs);
    CTcDataStream::write_at(&G_cs->super_CTcDataStream,ofs,(char *)&local_60,2);
    if (uVar10 == 0) {
      CTcGenTarg::write_op(G_cg,'\b');
      pCVar6 = G_cg;
      iVar12 = G_cg->sp_depth_;
      iVar7 = iVar12 + 1;
      G_cg->sp_depth_ = iVar7;
      if (pCVar6->max_sp_depth_ <= iVar12) {
        pCVar6->max_sp_depth_ = iVar7;
      }
    }
    CTcPrsNode::def_label_pos(local_48);
  }
  else {
    pCVar3 = (this->super_CTPNStrOneOfBase).lst_;
    (**(pCVar3->super_CTPNListBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)
              (pCVar3,0,0);
    pCVar4 = (this->super_CTPNStrOneOfBase).state_obj_;
    (*(pCVar4->super_CTcSymObjBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
      super_CVmHashEntry._vptr_CVmHashEntry[0x1e])(pCVar4,0,puVar9,0,0,0,0);
    CTcGenTarg::write_op(G_cg,0xba);
    G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
  }
  return;
}

Assistant:

void CTPNStrOneOf::gen_code(int discard, int for_condition)
{
    /*
     *   There are two components to the <<one of>> list.  First, there's the
     *   list of strings.  Second, there's an anonymous OneOfIndexGen object
     *   that we create; this object holds our state and generates our index
     *   values.
     *   
     *   In the simple case, the list is just a constant list of constant
     *   strings.  However, if the enclosing string is a dstring, each of
     *   these will be a dstring; and even if the outer string is an sstring,
     *   these could contain further embedded expressions, in which case they
     *   won't be constant.
     *   
     *   If the list is constant, we generate list[generator.getNextIndex()].
     *   This selects a string from the list and leaves it on the stack,
     *   which is just what our parent node wants.
     *   
     *   If the list isn't constant, we generate a switch on
     *   generator.getNextIndex(), and then fill in the case table from the
     *   list: each case label is the index, and each case's body is the code
     *   generated for the list element, followed by a 'break' to the end of
     *   the switch.  The effect once again is to pick an item from the list
     *   and push its value onto the stack.  
     */

    /* look up the getNextIndex property */
    CTcSymProp *propsym = (CTcSymProp *)G_prs->get_global_symtab()->
                          find_or_def_prop_explicit("getNextIndex", 12, FALSE);
    if (propsym->get_type() != TC_SYM_PROP)
    {
        G_tok->log_error(TCERR_ONEOF_REQ_GETNXT);
        return;
    }

    /* synthesize a constant value for the property */
    CTcConstVal propc;
    propc.set_prop(propsym->get_prop());
    CTPNConst *getNextIndex = new CTPNConst(&propc);

    /* generate the list */
    CTcConstVal *c = lst_->get_const_val();
    if (c != 0)
    {
        /* the list is a constant - push the list value */
        lst_->gen_code(FALSE, FALSE);

        /* call generator.getNextIndex() to get the next index */
        state_obj_->gen_code_member(FALSE, getNextIndex, FALSE, 0, FALSE, 0);

        /* index the list (this pops two values and pushes one) */
        G_cg->write_op(OPC_INDEX);
        G_cg->note_pop();
    }
    else
    {
        /* the list is non-constant - start by generating the index */
        state_obj_->gen_code_member(FALSE, getNextIndex, FALSE, 0, FALSE, 0);

        /* note the number of list elements */
        int i, cnt = lst_->get_count();

        /* generate the SWITCH <case_cnt> */
        G_cg->write_op(OPC_SWITCH);
        G_cs->write2(cnt);
        G_cg->note_pop();

        /* 
         *   Build the case table.  Each label is an index value; leave the
         *   jump offset zero for now, since we'll have to fill it in as we
         *   generate the code. 
         */
        ulong caseofs = G_cs->get_ofs();
        for (i = 1 ; i <= cnt ; ++i)
        {
            /* write the case label as the 1-based index value */
            char buf[VMB_DATAHOLDER];
            vm_val_t val;
            val.set_int(i);
            vmb_put_dh(buf, &val);
            G_cs->write(buf, VMB_DATAHOLDER);

            /* write a placeholder for the jump offset */
            G_cs->write2(0);
        }

        /* write a placeholder for the default case */
        G_cs->write2(0);

        /* create a forward label for the 'break' to the end of the switch */
        CTcCodeLabel *brklbl = G_cs->new_label_fwd();

        /* 
         *   Now run through the table and generate the code for each list
         *   element. 
         */
        CTPNListEle *ele;
        for (i = 1, ele = lst_->get_head() ; ele != 0 && i <= cnt ;
             ++i, caseofs += VMB_DATAHOLDER + 2, ele = ele->get_next())
        {
            /* set the jump to this case in the case table */
            G_cs->write2_at(caseofs + VMB_DATAHOLDER,
                            G_cs->get_ofs() - (caseofs + VMB_DATAHOLDER));

            /* generate the code for this list element */
            ele->get_expr()->gen_code(discard, for_condition);;

            /* generate a jump to the end of the table */
            G_cg->write_op(OPC_JMP);
            G_cs->write_ofs2(brklbl, 0);

            /* 
             *   since all of these branches proceed in parallel, only one
             *   push counts, so don't count every iteration - pretend that
             *   we've already popped the value that this case generated 
             */
            if (!discard)
                G_cg->note_pop();
        }

        /* write the default case - just push nil */
        G_cs->write2_at(caseofs, G_cs->get_ofs() - caseofs);
        if (!discard)
        {
            G_cg->write_op(OPC_PUSHNIL);
            G_cg->note_push();
        }

        /* this is the end of the switch - set the 'break' label here */
        def_label_pos(brklbl);
    }
}